

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

void __thiscall
unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::
decrement_inode_count<unodb::detail::olc_inode_4<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
          (olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>> *this)

{
  __int_type _Var1;
  reference pvVar2;
  __int_type old_inode_count;
  olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this_local;
  
  pvVar2 = std::array<std::atomic<unsigned_long>,_5UL>::operator[]
                     ((array<std::atomic<unsigned_long>,_5UL> *)(this + 0x180),1);
  LOCK();
  _Var1 = (pvVar2->super___atomic_base<unsigned_long>)._M_i;
  (pvVar2->super___atomic_base<unsigned_long>)._M_i =
       (pvVar2->super___atomic_base<unsigned_long>)._M_i - 1;
  UNLOCK();
  if (_Var1 == 0) {
    __assert_fail("old_inode_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                  ,0xaa3,
                  "void unodb::olc_db<unsigned long, std::span<const std::byte>>::decrement_inode_count() [Key = unsigned long, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_4<unsigned long, std::span<const std::byte>>]"
                 );
  }
  olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::decrease_memory_use
            ((olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)this,0x48
            );
  return;
}

Assistant:

constexpr void olc_db<Key, Value>::decrement_inode_count() noexcept {
  static_assert(detail::olc_inode_defs<Key, Value>::template is_inode<INode>());

  const auto old_inode_count UNODB_DETAIL_USED_IN_DEBUG =
      node_counts[as_i<INode::type>].fetch_sub(1, std::memory_order_relaxed);
  UNODB_DETAIL_ASSERT(old_inode_count > 0);

  decrease_memory_use(sizeof(INode));
}